

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O2

void __thiscall Bob::PermuteData(Bob *this)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer plVar6;
  Client *this_00;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int j;
  long lVar10;
  int i;
  long lVar11;
  _Vector_base<DataElement,_std::allocator<DataElement>_> local_c0;
  undefined1 local_a8 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Pi_R_D;
  undefined1 local_78 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  S;
  vector<DataElement,_std::allocator<DataElement>_> Temp;
  vector<DataElement,_std::allocator<DataElement>_> V;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_a8,(long)(this->super_Party).n_d,(allocator_type *)local_78);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_78,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
             (allocator_type *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
             (allocator_type *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Client::ReceiveDataVector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->cli);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<DataElement,_std::allocator<DataElement>_> *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base
            ((_Vector_base<DataElement,_std::allocator<DataElement>_> *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<DataElement,std::allocator<DataElement>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<DataElement*,std::vector<DataElement,std::allocator<DataElement>>>>
            ((vector<DataElement,std::allocator<DataElement>> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)local_78,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  lVar10 = 0;
  for (lVar11 = 0; uVar2 = (this->super_Party).n_d, lVar11 < (int)uVar2; lVar11 = lVar11 + 1) {
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
      iVar3 = (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      *(undefined8 *)
       (*(long *)&(this->super_Party).D.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar3].
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data +
       lVar9) = *(undefined8 *)
                 ((long)(((pointer)((long)local_78 + lVar11 * 0x18))->
                        super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar9);
      *(undefined8 *)
       ((long)Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[iVar3].val + lVar9) =
           *(undefined8 *)
            ((long)&((S.
                      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                    ._M_start + lVar9 + lVar10);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)((long)local_a8 + (long)iVar3 * 0x18),
                 (value_type *)
                 (*(long *)&(this->super_Party).R_D.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar11].
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data + lVar9));
    }
    lVar10 = lVar10 + 0x10;
  }
  pvVar4 = (this->super_Party).D.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->super_Party).U_D.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    lVar10 = *(long *)&pvVar5[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data;
    lVar11 = *(long *)&pvVar4[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data;
    plVar6 = (((pointer)((long)local_a8 + uVar8 * 0x18))->
             super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      plVar1 = (long *)(lVar11 + lVar9 * 8);
      *plVar1 = *plVar1 + *(long *)(lVar10 + lVar9 * 8);
      (Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage)->val[lVar9] =
           (Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)->val[lVar9] -
           (plVar6[lVar9] + *(long *)(lVar10 + lVar9 * 8));
    }
    Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 1;
  }
  this_00 = this->cli;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)&local_c0,
             (vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Client::SendDataVector
            (this_00,(vector<DataElement,_std::allocator<DataElement>_> *)&local_c0,
             (this->super_Party).n_p);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base(&local_c0);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base
            ((_Vector_base<DataElement,_std::allocator<DataElement>_> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base
            ((_Vector_base<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_78);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_a8);
  return;
}

Assistant:

void Bob::PermuteData()
{
    std::vector<std::vector<long>> Pi_R_D(n_d), S(n_d);
    std::vector<DataElement> V(n_d), Temp(n_d);
    V = cli->ReceiveDataVector();    //receive Alice's masked share of D
    Temp.assign(V.begin(), V.end());
    S.assign(D.begin(), D.end());
    for(int i=0; i < n_d; i++)
    {
        for(int j=0;  j < 2; j++)
        {
            D[Pi_D[i]][j] = S[i][j]; //Applying Pi on Bob's Share of D
            V[Pi_D[i]].val[j] = Temp[i].val[j]; //Applying Pi on Alice's masked Share of D
            Pi_R_D[Pi_D[i]].push_back(R_D[i][j]);  //Prepping shuffle vector needed for resplit
        }
    }
    for(int i=0; i < n_d; i++)
    {
        for(int j=0;  j < 2; j++)
        {
            D[i][j] += U_D[i][j];   //resplitting Bob's share of D
            V[i].val[j] = V[i].val[j] - Pi_R_D[i][j] - U_D[i][j]; //resplitting Alice's share of D
        }
    }
    cli->SendDataVector(V, n_p); //sending Alice her BlindPermuted share of D
}